

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRational.cpp
# Opt level: O3

double Imf_3_4::anon_unknown_1::denom(double x,double e)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = floor(x + e);
  if (e <= x - dVar1) {
    dVar1 = floor(1.0 / x + e);
    dVar3 = 1.0 / x - dVar1;
    if (e <= dVar3) {
      dVar2 = floor(1.0 / dVar3 + e);
      dVar2 = denom(1.0 / dVar3 - dVar2,e / (dVar3 * x * dVar3 * x));
      dVar3 = denom(dVar3,e / (x * x));
      dVar1 = dVar3 * dVar1 + dVar2;
    }
  }
  else {
    dVar1 = 1.0;
  }
  return dVar1;
}

Assistant:

double
denom (double x, double e)
{
    if (e > frac (x, e)) { return 1; }
    else
    {
        double r = frac (1 / x, e);

        if (e > r) { return floor (1 / x + e); }
        else
        {
            return denom (frac (1 / r, e), e / square (x * r)) +
                   floor (1 / x + e) * denom (frac (1 / x, e), e / square (x));
        }
    }
}